

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O0

void __thiscall
htmlcxx2::HTML::ParserSax::parseContent<char_const*>(ParserSax *this,char *begin,char *pos)

{
  size_t length;
  size_t sVar1;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  Node node;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string text;
  char *pos_local;
  char *begin_local;
  ParserSax *this_local;
  
  text.field_2._8_8_ = pos;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)local_40,begin,pos,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",&local_151);
  sVar1 = this->currentOffset_;
  length = std::__cxx11::string::length();
  Node::Node((Node *)local_108,&local_128,(string *)local_40,&local_150,sVar1,length,NODE_TEXT);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  sVar1 = Node::length((Node *)local_108);
  this->currentOffset_ = this->currentOffset_ + sVar1;
  (*this->_vptr_ParserSax[4])(this,local_108);
  Node::~Node((Node *)local_108);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void ParserSax::parseContent(It begin, It pos)
{
    std::string text(begin, pos);
    Node node("", text, "", currentOffset_, text.length(), Node::NODE_TEXT);
    currentOffset_ += node.length();
    onFoundText(node);
}